

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Oscilloscope::Get_y(ChFunction_Oscilloscope *this,double x)

{
  int iVar1;
  _List_node_base *p_Var2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM4_Qa;
  undefined1 auVar11 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar12 [16];
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->end_x;
  dVar4 = 0.0;
  if (x <= this->end_x) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->dx;
    auVar11._0_8_ = (double)(this->amount + -1);
    auVar11._8_8_ = in_XMM4_Qa;
    auVar7 = vfnmadd213sd_fma(auVar11,auVar9,auVar7);
    if (auVar7._0_8_ <= x) {
      auVar5._0_8_ = (x - auVar7._0_8_) / this->dx;
      auVar5._8_8_ = 0;
      auVar11 = vroundsd_avx(auVar5,auVar5,9);
      auVar6._0_4_ = (int)auVar11._0_8_;
      auVar6._4_4_ = (int)auVar11._8_8_;
      auVar6._8_8_ = 0;
      iVar1 = (int)auVar11._0_8_ + 1;
      auVar8._0_8_ = (double)iVar1;
      auVar8._8_8_ = in_XMM5_Qa;
      auVar11 = vcvtdq2pd_avx(auVar6);
      auVar11 = vfmadd213sd_fma(auVar11,auVar9,auVar7);
      auVar7 = vfmadd213sd_fma(auVar8,auVar9,auVar7);
      p_Var2 = (_List_node_base *)&this->values;
      do {
        p_Var2 = (((_List_base<double,_std::allocator<double>_> *)&p_Var2->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next;
        if (p_Var2 == (_List_node_base *)&this->values) {
          p_Var2 = (_List_node_base *)0x0;
          auVar10 = ZEXT816(0);
          goto LAB_00dc972e;
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = p_Var2[1]._M_next;
      p_Var2 = p_Var2->_M_next[1]._M_next;
LAB_00dc972e:
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (auVar7._0_8_ - x) * (double)p_Var2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = x - auVar11._0_8_;
      auVar9 = vfmadd231sd_fma(auVar3,auVar10,auVar12);
      dVar4 = auVar9._0_8_ / (auVar7._0_8_ - auVar11._0_8_);
    }
  }
  return dVar4;
}

Assistant:

double ChFunction_Oscilloscope::Get_y(double x) const {
    double y = 0;

    double start_x = this->end_x - this->dx * (this->amount - 1);
    if (x > end_x)
        return 0;
    if (x < start_x)
        return 0;

    int i1 = (int)floor((x - start_x) / this->dx);
    int i2 = i1 + 1;
    double p1x = start_x + dx * (double)i1;
    double p2x = start_x + dx * (double)i2;
    double p1y = 0;
    double p2y = 0;
    int count = 0;
    std::list<double>::const_iterator iter = values.begin();
    while (iter != values.end()) {
        if (count == i1) {
            p2y = *iter;
            iter++;
            p1y = *iter;
            break;
        }
        count++;
        iter++;
    }

    y = ((x - p1x) * p2y + (p2x - x) * p1y) / (p2x - p1x);

    return y;
}